

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMLSParserImpl::startElement
          (DOMLSParserImpl *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,bool isEmpty,bool isRoot)

{
  ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *this_00;
  MemoryManager *pMVar1;
  int iVar2;
  ValueHashTableBucketElem<bool> *pVVar3;
  ValueHashTableBucketElem<xercesc_4_0::DOMLSParserFilter::FilterAction> *pVVar4;
  FilterAction *pFVar5;
  ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *pVVar6;
  undefined4 extraout_var;
  DOMLSException *this_01;
  DOMNode *pDVar7;
  DOMLSParserFilter *pDVar8;
  XMLSize_t hashVal;
  uint local_3c;
  XMLCh *local_38;
  
  local_38 = elemPrefix;
  if ((this->fFilter != (DOMLSParserFilter *)0x0) &&
     (this_00 = this->fFilterDelayedTextNodes,
     this_00 != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0)) {
    pDVar7 = (this->super_AbstractDOMParser).fCurrentNode;
    for (pVVar3 = this_00->fBucketList[(ulong)pDVar7 % this_00->fHashModulus];
        pVVar3 != (ValueHashTableBucketElem<bool> *)0x0; pVVar3 = pVVar3->fNext) {
      if ((DOMNode *)pVVar3->fKey == pDVar7) {
        ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeBucketElem(this_00,pDVar7,&hashVal);
        applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
        break;
      }
    }
  }
  pDVar7 = (this->super_AbstractDOMParser).fCurrentParent;
  local_3c = urlId;
  AbstractDOMParser::startElement
            (&this->super_AbstractDOMParser,elemDecl,urlId,local_38,attrList,attrCount,false,isRoot)
  ;
  pDVar8 = this->fFilter;
  if (pDVar8 != (DOMLSParserFilter *)0x0) {
    pVVar6 = this->fFilterAction;
    if (pVVar6 != (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                   *)0x0) {
      for (pVVar4 = pVVar6->fBucketList[(ulong)pDVar7 % pVVar6->fHashModulus];
          pVVar4 != (ValueHashTableBucketElem<xercesc_4_0::DOMLSParserFilter::FilterAction> *)0x0;
          pVVar4 = pVVar4->fNext) {
        if ((DOMNode *)pVVar4->fKey == pDVar7) {
          pFVar5 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                   ::get(pVVar6,pDVar7,XMLPlatformUtils::fgMemoryManager);
          if (*pFVar5 == FILTER_REJECT) {
            pDVar7 = (this->super_AbstractDOMParser).fCurrentNode;
            pVVar6 = this->fFilterAction;
            hashVal._0_4_ = 2;
            goto LAB_002dc2da;
          }
          pDVar8 = this->fFilter;
          break;
        }
      }
    }
    hashVal._0_4_ =
         (*pDVar8->_vptr_DOMLSParserFilter[3])(pDVar8,(this->super_AbstractDOMParser).fCurrentNode);
    if ((int)hashVal - 2U < 2) {
      pVVar6 = this->fFilterAction;
      if (pVVar6 == (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                     *)0x0) {
        pVVar6 = (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                  *)XMemory::operator_new(0x30,(this->super_AbstractDOMParser).fMemoryManager);
        pMVar1 = (this->super_AbstractDOMParser).fMemoryManager;
        pVVar6->fMemoryManager = pMVar1;
        pVVar6->fBucketList =
             (ValueHashTableBucketElem<xercesc_4_0::DOMLSParserFilter::FilterAction> **)0x0;
        pVVar6->fHashModulus = 7;
        pVVar6->fInitialModulus = 7;
        pVVar6->fCount = 0;
        iVar2 = (*pMVar1->_vptr_MemoryManager[3])();
        pVVar6->fBucketList =
             (ValueHashTableBucketElem<xercesc_4_0::DOMLSParserFilter::FilterAction> **)
             CONCAT44(extraout_var,iVar2);
        memset((ValueHashTableBucketElem<xercesc_4_0::DOMLSParserFilter::FilterAction> **)
               CONCAT44(extraout_var,iVar2),0,pVVar6->fHashModulus << 3);
        this->fFilterAction = pVVar6;
      }
      pDVar7 = (this->super_AbstractDOMParser).fCurrentNode;
LAB_002dc2da:
      ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::put
                (pVVar6,pDVar7,(FilterAction *)&hashVal);
    }
    else if ((int)hashVal == 4) {
      this_01 = (DOMLSException *)__cxa_allocate_exception(0x28);
      DOMLSException::DOMLSException
                (this_01,0x51,0x22,(this->super_AbstractDOMParser).fMemoryManager);
      __cxa_throw(this_01,&DOMLSException::typeinfo,DOMLSException::~DOMLSException);
    }
  }
  if (isEmpty) {
    (*(this->super_AbstractDOMParser).super_XMLDocumentHandler._vptr_XMLDocumentHandler[6])
              (this,elemDecl,(ulong)local_3c,(ulong)isRoot,local_38);
  }
  return;
}

Assistant:

void DOMLSParserImpl::startElement(const XMLElementDecl&         elemDecl
                                 , const unsigned int            urlId
                                 , const XMLCh* const            elemPrefix
                                 , const RefVectorOf<XMLAttr>&   attrList
                                 , const XMLSize_t               attrCount
                                 , const bool                    isEmpty
                                 , const bool                    isRoot)
{
    if(fFilter)
    {
        // send the notification for the previous text node
        if(fFilterDelayedTextNodes && fFilterDelayedTextNodes->containsKey(fCurrentNode))
        {
            fFilterDelayedTextNodes->removeKey(fCurrentNode);
            applyFilter(fCurrentNode);
        }
    }

    DOMNode* origParent = fCurrentParent;
    AbstractDOMParser::startElement(elemDecl, urlId, elemPrefix, attrList, attrCount, false, isRoot);
    if(fFilter)
    {
        // if the parent was already rejected, reject this too
        if(fFilterAction && fFilterAction->containsKey(origParent) && fFilterAction->get(origParent)==DOMLSParserFilter::FILTER_REJECT)
            fFilterAction->put(fCurrentNode, DOMLSParserFilter::FILTER_REJECT);
        else
        {
            DOMLSParserFilter::FilterAction action = fFilter->startElement((DOMElement*)fCurrentNode);

            switch(action)
            {
            case DOMLSParserFilter::FILTER_ACCEPT:      break;
            case DOMLSParserFilter::FILTER_REJECT:
            case DOMLSParserFilter::FILTER_SKIP:        if(fFilterAction==0)
                                                            fFilterAction=new (fMemoryManager) ValueHashTableOf<DOMLSParserFilter::FilterAction, PtrHasher>(7, fMemoryManager);
                                                        fFilterAction->put(fCurrentNode, action);
                                                        break;
            case DOMLSParserFilter::FILTER_INTERRUPT:   throw DOMLSException(DOMLSException::PARSE_ERR, XMLDOMMsg::LSParser_ParsingAborted, fMemoryManager);
            }
        }
    }
    if(isEmpty)
        endElement(elemDecl, urlId, isRoot, elemPrefix);
}